

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

string * duckdb::ParseString(string *__return_storage_ptr__,Value *value,string *loption)

{
  LogicalTypeId LVar1;
  vector<duckdb::Value,_true> *this;
  BinderException *pBVar2;
  allocator local_79;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  while( true ) {
    if (value->is_null == true) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    LVar1 = (value->type_).id_;
    if (LVar1 != LIST) break;
    this = ListValue::GetChildren(value);
    if ((long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_start != 0x40) {
      pBVar2 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_78,"\"%s\" expects a single argument as a string value",&local_79)
      ;
      ::std::__cxx11::string::string((string *)&local_38,(string *)loption);
      BinderException::BinderException<std::__cxx11::string>(pBVar2,&local_78,&local_38);
      __cxa_throw(pBVar2,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    value = vector<duckdb::Value,_true>::get<true>(this,0);
  }
  if (LVar1 == VARCHAR) {
    Value::GetValue<std::__cxx11::string>(__return_storage_ptr__,value);
    return __return_storage_ptr__;
  }
  pBVar2 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_78,"\"%s\" expects a string argument!",&local_79);
  ::std::__cxx11::string::string((string *)&local_58,(string *)loption);
  BinderException::BinderException<std::__cxx11::string>(pBVar2,&local_78,&local_58);
  __cxa_throw(pBVar2,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static string ParseString(const Value &value, const string &loption) {
	if (value.IsNull()) {
		return string();
	}
	if (value.type().id() == LogicalTypeId::LIST) {
		auto &children = ListValue::GetChildren(value);
		if (children.size() != 1) {
			throw BinderException("\"%s\" expects a single argument as a string value", loption);
		}
		return ParseString(children[0], loption);
	}
	if (value.type().id() != LogicalTypeId::VARCHAR) {
		throw BinderException("\"%s\" expects a string argument!", loption);
	}
	return value.GetValue<string>();
}